

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

bool test10(void)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  size_t sVar7;
  bool bVar8;
  int c;
  queue<int> a;
  queue<int> b;
  int local_64;
  queue<int> local_60;
  queue<int> local_40;
  
  srand(0);
  local_60.mData = (int *)operator_new__(4);
  *local_60.mData = 0;
  local_60.mCap = 1;
  local_60.mSize = 0;
  local_60.mFront = 0;
  local_40.mData = (int *)operator_new__(4);
  *local_40.mData = 0;
  local_40.mCap = 1;
  local_40.mSize = 0;
  local_40.mFront = 0;
  iVar3 = 200;
  do {
    local_64 = rand();
    CP::queue<int>::push(&local_60,&local_64);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  iVar3 = 10;
  do {
    local_64 = rand();
    CP::queue<int>::push(&local_40,&local_64);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  iVar3 = 9000;
  do {
    local_64 = rand();
    CP::queue<int>::push(&local_60,&local_64);
    CP::queue<int>::push(&local_40,&local_64);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  iVar3 = 200;
  do {
    CP::queue<int>::pop(&local_60);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  iVar3 = 10;
  do {
    CP::queue<int>::pop(&local_40);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  bVar8 = local_60.mSize == local_40.mSize;
  if ((bVar8) &&
     (uVar1 = local_60.mFront, uVar4 = local_40.mFront, sVar7 = local_60.mSize, local_60.mSize != 0)
     ) {
    do {
      bVar8 = false;
      if (local_60.mData[uVar1 % local_60.mCap] != local_40.mData[uVar4 % local_40.mCap])
      goto LAB_00103ded;
      sVar7 = sVar7 - 1;
      uVar2 = local_40.mFront;
      uVar1 = uVar1 + 1;
      uVar5 = local_60.mFront;
      uVar4 = uVar4 + 1;
      sVar6 = local_60.mSize;
    } while (sVar7 != 0);
    do {
      sVar6 = sVar6 - 1;
      bVar8 = local_40.mData[uVar2 % local_40.mCap] == local_60.mData[uVar5 % local_60.mCap];
      if (!bVar8) break;
      uVar2 = uVar2 + 1;
      uVar5 = uVar5 + 1;
    } while (sVar6 != 0);
  }
  else if (local_40.mData == (int *)0x0) goto LAB_00103df2;
LAB_00103ded:
  operator_delete__(local_40.mData);
LAB_00103df2:
  if (local_60.mData != (int *)0x0) {
    operator_delete__(local_60.mData);
  }
  return bVar8;
}

Assistant:

bool test10() {
  srand(0);
  CP::queue<int> a,b;
  int f1 = 200;
  int f2 = 10;
  int same = 9000;
  for (int i = 0;i < f1;i++) a.push(rand());
  for (int i = 0;i < f2;i++) b.push(rand());
  for (int i = 0;i < same;i++) {
    int c = rand();
    a.push(c);
    b.push(c);
  }
  for (int i = 0;i < f1;i++) a.pop();
  for (int i = 0;i < f2;i++) b.pop();
  return ( ((a == b))  && ((b == a)));
}